

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O3

Directory *
CompoundFile::loadChildDir
          (map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
           *dirs,int32_t dirID,Stream *stream)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  int32_t local_54;
  Directory local_50;
  
  if (dirID == -1) {
LAB_0011f5c2:
    pmVar4 = (mapped_type *)0x0;
  }
  else {
    p_Var3 = (dirs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 != (_Base_ptr)0x0) {
      p_Var1 = &(dirs->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      do {
        if (dirID <= (int)p_Var3[1]._M_color) {
          p_Var5 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < dirID];
      } while (p_Var3 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= dirID))
      goto LAB_0011f5c2;
    }
    local_54 = dirID;
    (*(stream->super_Stream)._vptr_Stream[4])(stream,(ulong)(uint)(dirID << 7),0);
    paVar2 = &local_50.m_name.field_2;
    local_50.m_name._M_string_length = 0;
    local_50.m_name.field_2._M_local_buf[0] = L'\0';
    local_50.m_type = Empty;
    local_50.m_secID.m_id = -2;
    local_50.m_streamSize = 0;
    local_50.m_rightChild = -1;
    local_50.m_leftChild = -1;
    local_50.m_rootNode = -1;
    local_50.m_name._M_dataplus._M_p = (pointer)paVar2;
    Directory::load(&local_50,stream);
    pmVar4 = std::
             map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
             ::operator[](dirs,&local_54);
    std::__cxx11::wstring::_M_assign((wstring *)pmVar4);
    pmVar4->m_leftChild = local_50.m_leftChild;
    pmVar4->m_rootNode = local_50.m_rootNode;
    pmVar4->m_type = local_50.m_type;
    pmVar4->m_secID = (SecID)local_50.m_secID.m_id;
    pmVar4->m_streamSize = local_50.m_streamSize;
    pmVar4->m_rightChild = local_50.m_rightChild;
    pmVar4 = std::
             map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
             ::operator[](dirs,&local_54);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_50.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_50.m_name._M_dataplus._M_p,
                      CONCAT44(local_50.m_name.field_2._M_local_buf[1],
                               local_50.m_name.field_2._M_local_buf[0]) * 4 + 4);
    }
  }
  return pmVar4;
}

Assistant:

inline Directory *
loadChildDir( std::map< int32_t, Directory > & dirs,
	int32_t dirID, Stream & stream )
{
	if( dirID != -1 && dirs.count(dirID) == 0 )
	{
		stream.seek( dirID * dirRecordSize, Stream::FromBeginning );

		Directory dir;
		dir.load( stream );

		dirs[ dirID ] = dir;

		return &dirs[ dirID ];
	}

	return nullptr;
}